

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

int encrypt_ticket_cb(ptls_encrypt_ticket_t *_self,ptls_t *tls,int is_encrypt,ptls_buffer_t *dst,
                     ptls_iovec_t src)

{
  uint8_t *puVar1;
  size_t sVar2;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var3;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var4;
  int iVar5;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var6;
  ptls_context_t *ppVar7;
  uint8_t *puVar8;
  _func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *p_Var9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  p_Var9 = (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *)
           src.len;
  puVar8 = src.base;
  if (is_encrypt == 0) {
    if (p_Var9 != (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t
                   *)0x20) {
      return 0x205;
    }
    auVar11[0] = -(*puVar8 == *(uint8_t *)&_self[1].cb);
    auVar11[1] = -(puVar8[1] == *(uint8_t *)((long)&_self[1].cb + 1));
    auVar11[2] = -(puVar8[2] == *(uint8_t *)((long)&_self[1].cb + 2));
    auVar11[3] = -(puVar8[3] == *(uint8_t *)((long)&_self[1].cb + 3));
    auVar11[4] = -(puVar8[4] == *(uint8_t *)((long)&_self[1].cb + 4));
    auVar11[5] = -(puVar8[5] == *(uint8_t *)((long)&_self[1].cb + 5));
    auVar11[6] = -(puVar8[6] == *(uint8_t *)((long)&_self[1].cb + 6));
    auVar11[7] = -(puVar8[7] == *(uint8_t *)((long)&_self[1].cb + 7));
    auVar11[8] = -(puVar8[8] == *(uint8_t *)&_self[2].cb);
    auVar11[9] = -(puVar8[9] == *(uint8_t *)((long)&_self[2].cb + 1));
    auVar11[10] = -(puVar8[10] == *(uint8_t *)((long)&_self[2].cb + 2));
    auVar11[0xb] = -(puVar8[0xb] == *(uint8_t *)((long)&_self[2].cb + 3));
    auVar11[0xc] = -(puVar8[0xc] == *(uint8_t *)((long)&_self[2].cb + 4));
    auVar11[0xd] = -(puVar8[0xd] == *(uint8_t *)((long)&_self[2].cb + 5));
    auVar11[0xe] = -(puVar8[0xe] == *(uint8_t *)((long)&_self[2].cb + 6));
    auVar11[0xf] = -(puVar8[0xf] == *(uint8_t *)((long)&_self[2].cb + 7));
    auVar10[0] = -(puVar8[0x10] == *(uint8_t *)&_self[3].cb);
    auVar10[1] = -(puVar8[0x11] == *(uint8_t *)((long)&_self[3].cb + 1));
    auVar10[2] = -(puVar8[0x12] == *(uint8_t *)((long)&_self[3].cb + 2));
    auVar10[3] = -(puVar8[0x13] == *(uint8_t *)((long)&_self[3].cb + 3));
    auVar10[4] = -(puVar8[0x14] == *(uint8_t *)((long)&_self[3].cb + 4));
    auVar10[5] = -(puVar8[0x15] == *(uint8_t *)((long)&_self[3].cb + 5));
    auVar10[6] = -(puVar8[0x16] == *(uint8_t *)((long)&_self[3].cb + 6));
    auVar10[7] = -(puVar8[0x17] == *(uint8_t *)((long)&_self[3].cb + 7));
    auVar10[8] = -(puVar8[0x18] == *(uint8_t *)&_self[4].cb);
    auVar10[9] = -(puVar8[0x19] == *(uint8_t *)((long)&_self[4].cb + 1));
    auVar10[10] = -(puVar8[0x1a] == *(uint8_t *)((long)&_self[4].cb + 2));
    auVar10[0xb] = -(puVar8[0x1b] == *(uint8_t *)((long)&_self[4].cb + 3));
    auVar10[0xc] = -(puVar8[0x1c] == *(uint8_t *)((long)&_self[4].cb + 4));
    auVar10[0xd] = -(puVar8[0x1d] == *(uint8_t *)((long)&_self[4].cb + 5));
    auVar10[0xe] = -(puVar8[0x1e] == *(uint8_t *)((long)&_self[4].cb + 6));
    auVar10[0xf] = -(puVar8[0x1f] == *(uint8_t *)((long)&_self[4].cb + 7));
    auVar10 = auVar10 & auVar11;
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) != 0xffff) {
      return 0x205;
    }
    iVar5 = ptls_buffer_reserve(dst,(size_t)_self[6].cb);
    if (iVar5 != 0) {
      return iVar5;
    }
    memcpy(dst->base + dst->off,_self[5].cb,(size_t)_self[6].cb);
    p_Var6 = _self[6].cb;
  }
  else {
    free(_self[5].cb);
    p_Var6 = (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *
             )malloc((size_t)p_Var9);
    _self[5].cb = p_Var6;
    if (p_Var6 == (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t
                   *)0x0) {
      return 0x201;
    }
    ppVar7 = ptls_get_context(tls);
    p_Var6 = (_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t *
             )0x20;
    (*ppVar7->random_bytes)(_self + 1,0x20);
    memcpy(_self[5].cb,puVar8,(size_t)p_Var9);
    _self[6].cb = p_Var9;
    iVar5 = ptls_buffer_reserve(dst,0x20);
    if (iVar5 != 0) {
      return iVar5;
    }
    puVar8 = dst->base;
    sVar2 = dst->off;
    p_Var9 = _self[1].cb;
    p_Var3 = _self[2].cb;
    p_Var4 = _self[4].cb;
    puVar1 = puVar8 + sVar2 + 0x10;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)puVar1
         = _self[3].cb;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)
     (puVar1 + 8) = p_Var4;
    puVar8 = puVar8 + sVar2;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)puVar8
         = p_Var9;
    *(_func_int_st_ptls_encrypt_ticket_t_ptr_ptls_t_ptr_int_ptls_buffer_t_ptr_ptls_iovec_t **)
     (puVar8 + 8) = p_Var3;
  }
  dst->off = (size_t)(p_Var6 + dst->off);
  return 0;
}

Assistant:

static int encrypt_ticket_cb(ptls_encrypt_ticket_t *_self, ptls_t *tls, int is_encrypt, ptls_buffer_t *dst, ptls_iovec_t src)
{
    struct st_util_session_cache_t *self = (void *)_self;
    int ret;

    if (is_encrypt) {

        /* replace the cached entry along with a newly generated session id */
        free(self->data.base);
        if ((self->data.base = malloc(src.len)) == NULL)
            return PTLS_ERROR_NO_MEMORY;

        ptls_get_context(tls)->random_bytes(self->id, sizeof(self->id));
        memcpy(self->data.base, src.base, src.len);
        self->data.len = src.len;

        /* store the session id in buffer */
        if ((ret = ptls_buffer_reserve(dst, sizeof(self->id))) != 0)
            return ret;
        memcpy(dst->base + dst->off, self->id, sizeof(self->id));
        dst->off += sizeof(self->id);

    } else {

        /* check if session id is the one stored in cache */
        if (src.len != sizeof(self->id))
            return PTLS_ERROR_SESSION_NOT_FOUND;
        if (memcmp(self->id, src.base, sizeof(self->id)) != 0)
            return PTLS_ERROR_SESSION_NOT_FOUND;

        /* return the cached value */
        if ((ret = ptls_buffer_reserve(dst, self->data.len)) != 0)
            return ret;
        memcpy(dst->base + dst->off, self->data.base, self->data.len);
        dst->off += self->data.len;
    }

    return 0;
}